

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_miner.cpp
# Opt level: O1

optional<long> __thiscall
node::MiniMiner::CalculateTotalBumpFees(MiniMiner *this,CFeeRate *target_feerate)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  key_type *pkVar3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  CAmount CVar7;
  CTxIn *input;
  uchar *__k;
  long lVar8;
  ulong uVar9;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  _Storage<long,_true> unaff_R14;
  long lVar10;
  long in_FS_OFFSET;
  optional<CFeeRate> target_feerate_00;
  optional<long> oVar11;
  iterator parent_it;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> has_been_processed;
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  to_process;
  set<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  ancestors;
  _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> local_d0;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_c8;
  _Rb_tree<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Identity<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  local_98;
  _Rb_tree<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Identity<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = 0;
  if (this->m_ready_to_calculate == true) {
    target_feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._8_8_ = 1;
    target_feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_payload =
         (_Storage<CFeeRate,_true>)target_feerate->nSatoshisPerK;
    BuildMockTemplate(this,target_feerate_00);
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var5 = (this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    p_Var1 = &(this->m_requested_outpoints_by_txid)._M_t._M_impl.super__Rb_tree_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        cVar4 = std::
                _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                ::find(&(this->m_in_block)._M_t,(key_type *)(p_Var5 + 1));
        if (((_Rb_tree_header *)cVar4._M_node ==
             &(this->m_in_block)._M_t._M_impl.super__Rb_tree_header) &&
           (local_c8._M_impl._0_8_ =
                 std::
                 _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
                 ::find(&(this->m_entries_by_txid)._M_t,(key_type *)(p_Var5 + 1)),
           (_Rb_tree_header *)local_c8._M_impl._0_8_ !=
           &(this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header)) {
          std::
          _Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
          ::
          _M_insert_unique<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>const&>
                    ((_Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                      *)&local_98,
                     (_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                     &local_c8);
          std::
          _Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
          ::
          _M_insert_unique<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>const&>
                    ((_Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                      *)&local_68,
                     (_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *)
                     &local_c8);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c8._M_impl.super__Rb_tree_header._M_header;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var5 = local_68._M_impl.super__Rb_tree_header._M_header._M_left,
          p_Var6 = local_98._M_impl.super__Rb_tree_header._M_header._M_left,
          local_98._M_impl.super__Rb_tree_header._M_node_count != 0) {
      puVar2 = *(undefined8 **)
                (*(long *)(local_98._M_impl.super__Rb_tree_header._M_header._M_left + 1) + 0x40);
      pkVar3 = (key_type *)puVar2[1];
      for (__k = (uchar *)*puVar2; (key_type *)__k != pkVar3; __k = __k + 0x68) {
        local_d0._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<uint256,_std::pair<const_uint256,_node::MiniMinerMempoolEntry>,_std::_Select1st<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>
             ::find(&(this->m_entries_by_txid)._M_t,(key_type *)__k);
        if ((_Rb_tree_header *)local_d0._M_node !=
            &(this->m_entries_by_txid)._M_t._M_impl.super__Rb_tree_header) {
          cVar4 = std::
                  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                  ::find(&local_c8,(key_type *)__k);
          if ((_Rb_tree_header *)cVar4._M_node == &local_c8._M_impl.super__Rb_tree_header) {
            std::
            _Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
            ::
            _M_insert_unique<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>const&>
                      ((_Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                        *)&local_98,&local_d0);
          }
          std::
          _Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
          ::
          _M_insert_unique<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>const&>
                    ((_Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                      *)&local_68,&local_d0);
        }
      }
      std::
      _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>::
      _M_insert_unique<uint256_const&>
                ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                  *)&local_c8,(uint256 *)((long)puVar2 + 0x39));
      std::
      _Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
      ::erase_abi_cxx11_((_Rb_tree<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>,std::_Identity<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>,node::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<uint256_const,node::MiniMinerMempoolEntry>>>>
                          *)&local_98,(const_iterator)p_Var6);
    }
    p_Var1 = &local_68._M_impl.super__Rb_tree_header;
    lVar8 = 0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    for (p_Var6 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var1;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
      lVar8 = lVar8 + *(long *)(*(long *)(p_Var6 + 1) + 0x50);
    }
    lVar10 = 0;
    for (; (_Rb_tree_header *)p_Var5 != p_Var1;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
      lVar10 = lVar10 + *(long *)(*(long *)(p_Var5 + 1) + 0x60);
    }
    CVar7 = CFeeRate::GetFee(target_feerate,(uint32_t)lVar8);
    unaff_R14._M_value = CVar7 - lVar10;
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree(&local_c8);
    std::
    _Rb_tree<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Identity<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
    ::~_Rb_tree(&local_98);
    std::
    _Rb_tree<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>,_std::_Identity<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>,_node::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_>_>_>
    ::~_Rb_tree(&local_68);
    uVar9 = CONCAT71((int7)((ulong)lVar8 >> 8),1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  oVar11.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_
       = uVar9 & 0xffffffff;
  oVar11.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = unaff_R14._M_value;
  return (optional<long>)
         oVar11.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
  ;
}

Assistant:

std::optional<CAmount> MiniMiner::CalculateTotalBumpFees(const CFeeRate& target_feerate)
{
    if (!m_ready_to_calculate) return std::nullopt;
    // Build a block template until the target feerate is hit.
    BuildMockTemplate(target_feerate);

    // All remaining ancestors that are not part of m_in_block must be bumped, but no other relatives
    std::set<MockEntryMap::iterator, IteratorComparator> ancestors;
    std::set<MockEntryMap::iterator, IteratorComparator> to_process;
    for (const auto& [txid, outpoints] : m_requested_outpoints_by_txid) {
        // Skip any ancestors that already have a miner score higher than the target feerate
        // (already "made it" into the block)
        if (m_in_block.count(txid)) continue;
        auto iter = m_entries_by_txid.find(txid);
        if (iter == m_entries_by_txid.end()) continue;
        to_process.insert(iter);
        ancestors.insert(iter);
    }

    std::set<uint256> has_been_processed;
    while (!to_process.empty()) {
        auto iter = to_process.begin();
        const CTransaction& tx = (*iter)->second.GetTx();
        for (const auto& input : tx.vin) {
            if (auto parent_it{m_entries_by_txid.find(input.prevout.hash)}; parent_it != m_entries_by_txid.end()) {
                if (!has_been_processed.count(input.prevout.hash)) {
                    to_process.insert(parent_it);
                }
                ancestors.insert(parent_it);
            }
        }
        has_been_processed.insert(tx.GetHash());
        to_process.erase(iter);
    }
    const auto ancestor_package_size = std::accumulate(ancestors.cbegin(), ancestors.cend(), int64_t{0},
        [](int64_t sum, const auto it) {return sum + it->second.GetTxSize();});
    const auto ancestor_package_fee = std::accumulate(ancestors.cbegin(), ancestors.cend(), CAmount{0},
        [](CAmount sum, const auto it) {return sum + it->second.GetModifiedFee();});
    return target_feerate.GetFee(ancestor_package_size) - ancestor_package_fee;
}